

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convenience_socket_bases.cpp
# Opt level: O2

void __thiscall
tlm_utils::convenience_socket_base::display_warning(convenience_socket_base *this,char *text)

{
  long lVar1;
  ostream *poVar2;
  char *msg_type_;
  char *local_1b8;
  stringstream s;
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&s);
  lVar1 = (**(code **)(*(long *)this + 0x18))(this);
  poVar2 = std::operator<<(local_188,*(char **)(lVar1 + 0x40));
  poVar2 = std::operator<<(poVar2,": ");
  std::operator<<(poVar2,text);
  msg_type_ = (char *)(**(code **)(*(long *)this + 0x10))(this);
  std::__cxx11::stringbuf::str();
  sc_core::sc_report_handler::report
            (SC_WARNING,msg_type_,local_1b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/tlm_utils/convenience_socket_bases.cpp"
             ,0x22);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::stringstream::~stringstream((stringstream *)&s);
  return;
}

Assistant:

void
convenience_socket_base::display_warning(const char* text) const
{
  std::stringstream s;
  s << get_socket()->name() << ": " << text;
  SC_REPORT_WARNING(get_report_type(), s.str().c_str());
}